

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O3

string * __thiscall
LinearRegression::generatePrintFunction_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  long *plVar8;
  undefined8 *puVar9;
  ulong uVar10;
  size_type *psVar11;
  char cVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong *puVar15;
  size_t __position;
  string __str;
  string __str_1;
  string __str_2;
  string printGrad;
  string printParam;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  string local_188;
  ulong *local_168;
  undefined8 local_160;
  ulong local_158;
  undefined8 uStack_150;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  ulong *local_128;
  long local_120;
  ulong local_118;
  long lStack_110;
  ulong *local_108;
  uint local_100;
  undefined4 uStack_fc;
  ulong local_f8 [2];
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  string local_c8;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string *local_48;
  var_bitset *local_40;
  var_bitset *local_38;
  
  local_128 = &local_118;
  local_48 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x06');
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
  puVar7 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar7) {
    local_1d8 = *puVar7;
    lStack_1d0 = puVar5[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *puVar7;
    local_1e8 = (ulong *)*puVar5;
  }
  local_1e0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_1b8 = *puVar7;
    lStack_1b0 = plVar6[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar7;
    local_1c8 = (ulong *)*plVar6;
  }
  local_1c0 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar13 = (this->_parameterIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start[100];
  cVar12 = '\x01';
  if (9 < uVar13) {
    uVar10 = uVar13;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (uVar10 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0014a269;
      }
      if (uVar10 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0014a269;
      }
      if (uVar10 < 10000) goto LAB_0014a269;
      bVar4 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_0014a269:
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1a8,(uint)local_1a0,uVar13);
  uVar13 = 0xf;
  if (local_1c8 != &local_1b8) {
    uVar13 = local_1b8;
  }
  if (uVar13 < (ulong)(local_1a0 + local_1c0)) {
    uVar13 = 0xf;
    if (local_1a8 != &local_198) {
      uVar13 = local_198;
    }
    if (uVar13 < (ulong)(local_1a0 + local_1c0)) goto LAB_0014a2d1;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1c8);
  }
  else {
LAB_0014a2d1:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1a8);
  }
  local_a8 = &local_98;
  puVar9 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar9) {
    local_98 = *puVar9;
    uStack_90 = puVar5[3];
  }
  else {
    local_98 = *puVar9;
    local_a8 = (undefined8 *)*puVar5;
  }
  local_a0 = puVar5[1];
  *puVar5 = puVar9;
  puVar5[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
  local_68 = &local_58;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_58 = *plVar8;
    lStack_50 = plVar6[3];
  }
  else {
    local_58 = *plVar8;
    local_68 = (long *)*plVar6;
  }
  local_60 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,'\x06');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_118 = *puVar7;
    lStack_110 = plVar6[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *puVar7;
    local_128 = (ulong *)*plVar6;
  }
  local_120 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
  puVar7 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar7) {
    local_1d8 = *puVar7;
    lStack_1d0 = puVar5[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *puVar7;
    local_1e8 = (ulong *)*puVar5;
  }
  local_1e0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  uVar13 = (this->_parameterIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start[100];
  cVar12 = '\x01';
  if (9 < uVar13) {
    uVar10 = uVar13;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (uVar10 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0014a536;
      }
      if (uVar10 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0014a536;
      }
      if (uVar10 < 10000) goto LAB_0014a536;
      bVar4 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_0014a536:
  local_148 = &local_138;
  std::__cxx11::string::_M_construct((ulong)&local_148,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_148,(uint)local_140,uVar13);
  uVar13 = 0xf;
  if (local_1e8 != &local_1d8) {
    uVar13 = local_1d8;
  }
  if (uVar13 < (ulong)(local_140 + local_1e0)) {
    uVar13 = 0xf;
    if (local_148 != &local_138) {
      uVar13 = local_138;
    }
    if (uVar13 < (ulong)(local_140 + local_1e0)) goto LAB_0014a5b2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_1e8);
  }
  else {
LAB_0014a5b2:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_148);
  }
  local_1c8 = &local_1b8;
  puVar7 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar7) {
    local_1b8 = *puVar7;
    lStack_1b0 = puVar5[3];
  }
  else {
    local_1b8 = *puVar7;
    local_1c8 = (ulong *)*puVar5;
  }
  local_1c0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)puVar7 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
  puVar9 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar9) {
    local_98 = *puVar9;
    uStack_90 = puVar5[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar9;
    local_a8 = (undefined8 *)*puVar5;
  }
  local_a0 = puVar5[1];
  *puVar5 = puVar9;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  local_38 = &(this->super_Application)._features;
  local_40 = &this->_categoricalFeatures;
  __position = 0;
  do {
    bVar4 = std::bitset<100UL>::test(local_38,__position);
    if (bVar4) {
      bVar4 = std::bitset<100UL>::test(local_40,__position);
      if (bVar4) {
        local_108 = local_f8;
        std::__cxx11::string::_M_construct((ulong)&local_108,'\x06');
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        puVar7 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_188.field_2._M_allocated_capacity = *puVar7;
          local_188.field_2._8_8_ = plVar6[3];
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar7;
          local_188._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_188._M_string_length = plVar6[1];
        *plVar6 = (long)puVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_c8,this,__position);
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          uVar14 = local_188.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_c8._M_string_length + local_188._M_string_length) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            uVar14 = local_c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_c8._M_string_length + local_188._M_string_length)
          goto LAB_0014a871;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_c8,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
        }
        else {
LAB_0014a871:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_188,(ulong)local_c8._M_dataplus._M_p);
        }
        local_168 = &local_158;
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_158 = *puVar7;
          uStack_150 = puVar5[3];
        }
        else {
          local_158 = *puVar7;
          local_168 = (ulong *)*puVar5;
        }
        local_160 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
        puVar7 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar7) {
          local_138 = *puVar7;
          lStack_130 = plVar6[3];
          local_148 = &local_138;
        }
        else {
          local_138 = *puVar7;
          local_148 = (ulong *)*plVar6;
        }
        local_140 = plVar6[1];
        *plVar6 = (long)puVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        local_e8 = local_d8;
        std::__cxx11::string::_M_construct((ulong)&local_e8,'\t');
        uVar13 = 0xf;
        if (local_148 != &local_138) {
          uVar13 = local_138;
        }
        if (uVar13 < (ulong)(local_e0 + local_140)) {
          uVar13 = 0xf;
          if (local_e8 != local_d8) {
            uVar13 = local_d8[0];
          }
          if (uVar13 < (ulong)(local_e0 + local_140)) goto LAB_0014aa65;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_148);
        }
        else {
LAB_0014aa65:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_e8)
          ;
        }
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_198 = *puVar7;
          lStack_190 = puVar5[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *puVar7;
          local_1a8 = (ulong *)*puVar5;
        }
        local_1a0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_118 = *puVar7;
          lStack_110 = puVar5[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *puVar7;
          local_128 = (ulong *)*puVar5;
        }
        local_120 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_88,this,__position);
        uVar13 = 0xf;
        if (local_128 != &local_118) {
          uVar13 = local_118;
        }
        if (uVar13 < local_88._M_string_length + local_120) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            uVar14 = local_88.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_88._M_string_length + local_120) goto LAB_0014acbc;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_128);
        }
        else {
LAB_0014acbc:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_128,(ulong)local_88._M_dataplus._M_p);
        }
        local_1e8 = &local_1d8;
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_1d8 = *puVar7;
          lStack_1d0 = puVar5[3];
        }
        else {
          local_1d8 = *puVar7;
          local_1e8 = (ulong *)*puVar5;
        }
        local_1e0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        local_1c8 = &local_1b8;
        puVar7 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar7) {
          local_1b8 = *puVar7;
          lStack_1b0 = plVar6[3];
        }
        else {
          local_1b8 = *puVar7;
          local_1c8 = (ulong *)*plVar6;
        }
        local_1c0 = plVar6[1];
        *plVar6 = (long)puVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_1c8);
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8);
        }
        if (local_e8 != local_d8) {
          operator_delete(local_e8);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        local_108 = local_f8;
        std::__cxx11::string::_M_construct((ulong)&local_108,'\x06');
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        puVar7 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_188.field_2._M_allocated_capacity = *puVar7;
          local_188.field_2._8_8_ = plVar6[3];
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar7;
          local_188._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_188._M_string_length = plVar6[1];
        *plVar6 = (long)puVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_c8,this,__position);
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          uVar14 = local_188.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_c8._M_string_length + local_188._M_string_length) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            uVar14 = local_c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_c8._M_string_length + local_188._M_string_length)
          goto LAB_0014af66;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_c8,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
        }
        else {
LAB_0014af66:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_188,(ulong)local_c8._M_dataplus._M_p);
        }
        local_168 = &local_158;
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_158 = *puVar7;
          uStack_150 = puVar5[3];
        }
        else {
          local_158 = *puVar7;
          local_168 = (ulong *)*puVar5;
        }
        local_160 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
        puVar7 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar7) {
          local_138 = *puVar7;
          lStack_130 = plVar6[3];
          local_148 = &local_138;
        }
        else {
          local_138 = *puVar7;
          local_148 = (ulong *)*plVar6;
        }
        local_140 = plVar6[1];
        *plVar6 = (long)puVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        local_e8 = local_d8;
        std::__cxx11::string::_M_construct((ulong)&local_e8,'\t');
        uVar13 = 0xf;
        if (local_148 != &local_138) {
          uVar13 = local_138;
        }
        if (uVar13 < (ulong)(local_e0 + local_140)) {
          uVar13 = 0xf;
          if (local_e8 != local_d8) {
            uVar13 = local_d8[0];
          }
          if (uVar13 < (ulong)(local_e0 + local_140)) goto LAB_0014b0bd;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_148);
        }
        else {
LAB_0014b0bd:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_e8)
          ;
        }
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_198 = *puVar7;
          lStack_190 = puVar5[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *puVar7;
          local_1a8 = (ulong *)*puVar5;
        }
        local_1a0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_118 = *puVar7;
          lStack_110 = puVar5[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *puVar7;
          local_128 = (ulong *)*puVar5;
        }
        local_120 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_88,this,__position);
        uVar13 = 0xf;
        if (local_128 != &local_118) {
          uVar13 = local_118;
        }
        if (uVar13 < local_88._M_string_length + local_120) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            uVar14 = local_88.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_88._M_string_length + local_120) goto LAB_0014b1ee;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_128);
        }
        else {
LAB_0014b1ee:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_128,(ulong)local_88._M_dataplus._M_p);
        }
        local_1e8 = &local_1d8;
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_1d8 = *puVar7;
          lStack_1d0 = puVar5[3];
        }
        else {
          local_1d8 = *puVar7;
          local_1e8 = (ulong *)*puVar5;
        }
        local_1e0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
        local_1c8 = &local_1b8;
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_1b8 = *puVar7;
          lStack_1b0 = puVar5[3];
        }
        else {
          local_1b8 = *puVar7;
          local_1c8 = (ulong *)*puVar5;
        }
        local_1c0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_1c8);
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8);
        }
        if (local_e8 != local_d8) {
          operator_delete(local_e8);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        puVar7 = local_f8;
        puVar15 = local_108;
      }
      else {
        local_168 = &local_158;
        std::__cxx11::string::_M_construct((ulong)&local_168,'\x06');
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
        puVar7 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar7) {
          local_138 = *puVar7;
          lStack_130 = plVar6[3];
          local_148 = &local_138;
        }
        else {
          local_138 = *puVar7;
          local_148 = (ulong *)*plVar6;
        }
        local_140 = plVar6[1];
        *plVar6 = (long)puVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_188,this,__position);
        uVar13 = 0xf;
        if (local_148 != &local_138) {
          uVar13 = local_138;
        }
        if (uVar13 < local_188._M_string_length + local_140) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            uVar14 = local_188.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_188._M_string_length + local_140) goto LAB_0014a904;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_148);
        }
        else {
LAB_0014a904:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_148,(ulong)local_188._M_dataplus._M_p);
        }
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_198 = *puVar7;
          lStack_190 = puVar5[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *puVar7;
          local_1a8 = (ulong *)*puVar5;
        }
        local_1a0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_118 = *puVar7;
          lStack_110 = puVar5[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *puVar7;
          local_128 = (ulong *)*puVar5;
        }
        local_120 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        uVar13 = (this->_parameterIndex).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[__position];
        cVar12 = '\x01';
        if (9 < uVar13) {
          uVar10 = uVar13;
          cVar3 = '\x04';
          do {
            cVar12 = cVar3;
            if (uVar10 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0014b3b2;
            }
            if (uVar10 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0014b3b2;
            }
            if (uVar10 < 10000) goto LAB_0014b3b2;
            bVar4 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar3 = cVar12 + '\x04';
          } while (bVar4);
          cVar12 = cVar12 + '\x01';
        }
LAB_0014b3b2:
        local_108 = local_f8;
        std::__cxx11::string::_M_construct((ulong)&local_108,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,uVar13);
        uVar13 = 0xf;
        if (local_128 != &local_118) {
          uVar13 = local_118;
        }
        uVar10 = CONCAT44(uStack_fc,local_100) + local_120;
        if (uVar13 < uVar10) {
          uVar13 = 0xf;
          if (local_108 != local_f8) {
            uVar13 = local_f8[0];
          }
          if (uVar13 < uVar10) goto LAB_0014b449;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_128);
        }
        else {
LAB_0014b449:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_108);
        }
        local_1e8 = &local_1d8;
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_1d8 = *puVar7;
          lStack_1d0 = puVar5[3];
        }
        else {
          local_1d8 = *puVar7;
          local_1e8 = (ulong *)*puVar5;
        }
        local_1e0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        local_1c8 = &local_1b8;
        puVar7 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar7) {
          local_1b8 = *puVar7;
          lStack_1b0 = plVar6[3];
        }
        else {
          local_1b8 = *puVar7;
          local_1c8 = (ulong *)*plVar6;
        }
        local_1c0 = plVar6[1];
        *plVar6 = (long)puVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_1c8);
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8);
        }
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168);
        }
        local_168 = &local_158;
        std::__cxx11::string::_M_construct((ulong)&local_168,'\x06');
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_138 = *puVar7;
          lStack_130 = puVar5[3];
          local_148 = &local_138;
        }
        else {
          local_138 = *puVar7;
          local_148 = (ulong *)*puVar5;
        }
        local_140 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_188,this,__position);
        uVar13 = 0xf;
        if (local_148 != &local_138) {
          uVar13 = local_138;
        }
        if (uVar13 < local_188._M_string_length + local_140) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            uVar14 = local_188.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_188._M_string_length + local_140) goto LAB_0014b6a2;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_148);
        }
        else {
LAB_0014b6a2:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_148,(ulong)local_188._M_dataplus._M_p);
        }
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_198 = *puVar7;
          lStack_190 = puVar5[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *puVar7;
          local_1a8 = (ulong *)*puVar5;
        }
        local_1a0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_118 = *puVar7;
          lStack_110 = puVar5[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *puVar7;
          local_128 = (ulong *)*puVar5;
        }
        local_120 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        uVar13 = (this->_parameterIndex).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[__position];
        cVar12 = '\x01';
        if (9 < uVar13) {
          uVar10 = uVar13;
          cVar3 = '\x04';
          do {
            cVar12 = cVar3;
            if (uVar10 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0014b7c8;
            }
            if (uVar10 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0014b7c8;
            }
            if (uVar10 < 10000) goto LAB_0014b7c8;
            bVar4 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar3 = cVar12 + '\x04';
          } while (bVar4);
          cVar12 = cVar12 + '\x01';
        }
LAB_0014b7c8:
        local_108 = local_f8;
        std::__cxx11::string::_M_construct((ulong)&local_108,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,uVar13);
        uVar13 = 0xf;
        if (local_128 != &local_118) {
          uVar13 = local_118;
        }
        uVar10 = CONCAT44(uStack_fc,local_100) + local_120;
        if (uVar13 < uVar10) {
          uVar13 = 0xf;
          if (local_108 != local_f8) {
            uVar13 = local_f8[0];
          }
          if (uVar13 < uVar10) goto LAB_0014b85f;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_128);
        }
        else {
LAB_0014b85f:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_108);
        }
        local_1e8 = &local_1d8;
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_1d8 = *puVar7;
          lStack_1d0 = puVar5[3];
        }
        else {
          local_1d8 = *puVar7;
          local_1e8 = (ulong *)*puVar5;
        }
        local_1e0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
        local_1c8 = &local_1b8;
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_1b8 = *puVar7;
          lStack_1b0 = puVar5[3];
        }
        else {
          local_1b8 = *puVar7;
          local_1c8 = (ulong *)*puVar5;
        }
        local_1c0 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_1c8);
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8);
        }
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148);
        }
        puVar7 = &local_158;
        puVar15 = local_168;
      }
      if (puVar15 != puVar7) {
        operator_delete(puVar15);
      }
    }
    __position = __position + 1;
  } while (__position != 100);
  local_108 = local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,'\x03');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
  paVar1 = &local_188.field_2;
  puVar7 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_188.field_2._M_allocated_capacity = *puVar7;
    local_188.field_2._8_8_ = plVar6[3];
    local_188._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_188.field_2._M_allocated_capacity = *puVar7;
    local_188._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_188._M_string_length = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_c8,'\x03');
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    uVar14 = local_188.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_c8._M_string_length + local_188._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar14 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_c8._M_string_length + local_188._M_string_length) goto LAB_0014bade;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_c8,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
  }
  else {
LAB_0014bade:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_c8._M_dataplus._M_p);
  }
  local_168 = &local_158;
  puVar7 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar7) {
    local_158 = *puVar7;
    uStack_150 = puVar5[3];
  }
  else {
    local_158 = *puVar7;
    local_168 = (ulong *)*puVar5;
  }
  local_160 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)puVar7 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
  puVar7 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar7) {
    local_138 = *puVar7;
    lStack_130 = puVar5[3];
    local_148 = &local_138;
  }
  else {
    local_138 = *puVar7;
    local_148 = (ulong *)*puVar5;
  }
  local_140 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_68);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_198 = *puVar7;
    lStack_190 = plVar6[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *puVar7;
    local_1a8 = (ulong *)*plVar6;
  }
  local_1a0 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
  puVar7 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar7) {
    local_118 = *puVar7;
    lStack_110 = puVar5[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *puVar7;
    local_128 = (ulong *)*puVar5;
  }
  local_120 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_a8);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_1d8 = *puVar7;
    lStack_1d0 = plVar6[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *puVar7;
    local_1e8 = (ulong *)*plVar6;
  }
  local_1e0 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,'\x03');
  uVar13 = 0xf;
  if (local_1e8 != &local_1d8) {
    uVar13 = local_1d8;
  }
  if (uVar13 < (ulong)(local_e0 + local_1e0)) {
    uVar13 = 0xf;
    if (local_e8 != local_d8) {
      uVar13 = local_d8[0];
    }
    if ((ulong)(local_e0 + local_1e0) <= uVar13) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_1e8);
      goto LAB_0014bd53;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_e8);
LAB_0014bd53:
  local_1c8 = &local_1b8;
  puVar7 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar7) {
    local_1b8 = *puVar7;
    lStack_1b0 = puVar5[3];
  }
  else {
    local_1b8 = *puVar7;
    local_1c8 = (ulong *)*puVar5;
  }
  local_1c0 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)puVar7 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  (local_48->_M_dataplus)._M_p = (pointer)&local_48->field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    lVar2 = plVar6[3];
    (local_48->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&local_48->field_2 + 8) = lVar2;
  }
  else {
    (local_48->_M_dataplus)._M_p = (pointer)*plVar6;
    (local_48->field_2)._M_allocated_capacity = *psVar11;
  }
  local_48->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return local_48;
}

Assistant:

std::string LinearRegression::generatePrintFunction()
{
    std::string printParam = offset(2)+"std::cout << \"param_int = \" << "+
        "params["+std::to_string(_parameterIndex[NUM_OF_VARIABLES])+"] << \";\\n\";\n";
    
    std::string printGrad = offset(2)+"std::cout << \"grad_int = \" << "+
        "grad["+std::to_string(_parameterIndex[NUM_OF_VARIABLES])+"] << \";\\n\";\n";
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;

        if (!_categoricalFeatures.test(var))
        {
            printParam += offset(2)+"std::cout << \"param_"+getAttributeName(var)+" = "
                "\" << params["+std::to_string(_parameterIndex[var])+"] << \";\\n\";\n";
            printGrad += offset(2)+"std::cout << \"grad_"+getAttributeName(var)+" = "
                "\" << grad["+std::to_string(_parameterIndex[var])+"] <<\";\\n\";\n";
        }
        else
        {            
            printParam += offset(2)+"for (std::pair<int,size_t> tuple : index_"+
                getAttributeName(var)+")\n"+
                offset(3)+"std::cout << \"param_"+getAttributeName(var)+
                "[\"<< tuple.first <<\"] = \"<< params[tuple.second] << \";\\n\";\n";
            printGrad += offset(2)+"for (std::pair<int,size_t> tuple : index_"+
                getAttributeName(var)+")\n"+
                offset(3)+"std::cout << \"grad_"+getAttributeName(var)+
                "[\"<< tuple.first <<\"] = \"<< grad[tuple.second] << \";\\n\";\n";
        }
    }

    return offset(1)+"void printOutput()\n"+offset(1)+"{\n"+printParam+"\n"+
        printGrad+offset(1)+"}\n";
}